

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

bool __thiscall dxil_spv::CFGStructurizer::rewrite_invalid_loop_breaks(CFGStructurizer *this)

{
  pointer ppCVar1;
  CFGNode *pCVar2;
  CFGNode *node;
  undefined4 id;
  bool bVar3;
  uint32_t uVar4;
  Id IVar5;
  CFGNode *to;
  Builder *pBVar6;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
  *paVar8;
  pointer ppCVar9;
  CFGNode *dominator;
  ulong uVar10;
  char cVar11;
  size_t i;
  long lVar12;
  ulong uVar13;
  CFGNode *invalid_target;
  IncomingValue incoming;
  PHI phi;
  CFGNode *merge;
  CFGNode *local_d0;
  undefined1 local_c8 [24];
  undefined8 uStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
  local_a8;
  void *local_98;
  iterator iStack_90;
  IncomingValue *local_88;
  undefined8 local_80;
  pointer pPStack_78;
  Builder *local_70;
  pointer local_68;
  pointer local_60;
  CFGNode *local_58;
  _Alloc_hider local_50;
  
  local_d0 = (CFGNode *)0x0;
  ppCVar1 = (this->forward_post_visit_order).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  dominator = (CFGNode *)0x0;
  for (ppCVar9 = (this->forward_post_visit_order).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar9 != ppCVar1;
      ppCVar9 = ppCVar9 + 1) {
    pCVar2 = *ppCVar9;
    if ((pCVar2->merge == Loop) && (pCVar2->freeze_structured_analysis == true)) {
      local_50._M_p = (pointer)pCVar2->loop_merge_block;
      cVar11 = '\x03';
      if ((CFGNode *)local_50._M_p != (CFGNode *)0x0) {
        bVar3 = CFGNode::post_dominates((CFGNode *)local_50._M_p,pCVar2);
        if (!bVar3) {
          local_c8._0_8_ = &stack0xffffffffffffffb0;
          local_c8._8_8_ = &local_d0;
          local_a8._M_allocated_capacity = (size_type)&pPStack_78;
          local_a8._8_8_ = 1;
          local_98 = (void *)0x0;
          iStack_90._M_current = (IncomingValue *)0x0;
          local_88 = (IncomingValue *)CONCAT44(local_88._4_4_,0x3f800000);
          local_80 = 0;
          pPStack_78 = (pointer)0x0;
          local_c8._16_8_ = this;
          CFGNode::
          traverse_dominated_blocks<dxil_spv::CFGStructurizer::rewrite_invalid_loop_breaks()::__0>
                    (pCVar2,(UnorderedSet<const_CFGNode_*> *)&local_a8,pCVar2,
                     (anon_class_24_3_8fce9826 *)local_c8);
          std::
          _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&local_a8);
          if (local_d0 != (CFGNode *)0x0) {
            dominator = pCVar2;
          }
          cVar11 = (local_d0 != (CFGNode *)0x0) * '\x02';
        }
      }
    }
    else {
      cVar11 = '\0';
    }
    if ((cVar11 != '\x03') && (cVar11 != '\0')) break;
  }
  pCVar2 = local_d0;
  if (local_d0 != (CFGNode *)0x0) {
    node = dominator->loop_merge_block;
    to = create_helper_pred_block(this,node);
    dominator->loop_merge_block = to;
    local_60 = (to->pred).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_68 = (to->pred).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    traverse_dominated_blocks_and_rewrite_branch(this,dominator,local_d0,to);
    local_88 = (IncomingValue *)0x0;
    local_98 = (void *)0x0;
    iStack_90._M_current = (IncomingValue *)0x0;
    local_a8._M_allocated_capacity = 0;
    local_a8._8_8_ = local_a8._8_8_ & 0xffffffffffffff00;
    uVar4 = SPIRVModule::allocate_id(this->module);
    local_a8._M_allocated_capacity._0_4_ = uVar4;
    pBVar6 = SPIRVModule::get_builder(this->module);
    IVar5 = spv::Builder::makeBoolType(pBVar6);
    local_a8._M_allocated_capacity._4_4_ = IVar5;
    local_70 = SPIRVModule::get_builder(this->module);
    id = local_a8._M_allocated_capacity._0_4_;
    local_50._M_p = &stack0xffffffffffffffc0;
    std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>> *)
               &stack0xffffffffffffffb0,"break_selector_","");
    local_58 = node;
    pbVar7 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
             _M_append((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                        *)&stack0xffffffffffffffb0,(node->name)._M_dataplus._M_p,
                       (node->name)._M_string_length);
    local_c8._0_8_ = (pbVar7->_M_dataplus)._M_p;
    paVar8 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
         *)local_c8._0_8_ == paVar8) {
      local_c8._16_8_ = paVar8->_M_allocated_capacity;
      uStack_b0 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_c8._0_8_ = (CFGNode *)(local_c8 + 0x10);
    }
    else {
      local_c8._16_8_ = paVar8->_M_allocated_capacity;
    }
    local_c8._8_8_ = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    spv::Builder::addName(local_70,id,(char *)local_c8._0_8_);
    if ((CFGNode *)local_c8._0_8_ != (CFGNode *)(local_c8 + 0x10)) {
      free_in_thread((void *)local_c8._0_8_);
    }
    ppCVar1 = local_60;
    ppCVar9 = local_68;
    lVar12 = (long)local_68 - (long)local_60;
    if (local_50._M_p != &stack0xffffffffffffffc0) {
      free_in_thread(local_50._M_p);
    }
    uVar13 = lVar12 >> 3;
    if (ppCVar9 != ppCVar1) {
      lVar12 = 0;
      do {
        local_c8._8_8_ = local_c8._8_8_ & 0xffffffff00000000;
        local_c8._0_8_ =
             (to->pred).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar12];
        pBVar6 = SPIRVModule::get_builder(this->module);
        IVar5 = spv::Builder::makeBoolConstant(pBVar6,true,false);
        local_c8._8_4_ = IVar5;
        if (iStack_90._M_current == local_88) {
          std::
          vector<dxil_spv::IncomingValue,dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>>::
          _M_realloc_insert<dxil_spv::IncomingValue_const&>
                    ((vector<dxil_spv::IncomingValue,dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>>
                      *)&local_98,iStack_90,(IncomingValue *)local_c8);
        }
        else {
          (iStack_90._M_current)->block = (CFGNode *)local_c8._0_8_;
          *(undefined8 *)&(iStack_90._M_current)->id = local_c8._8_8_;
          iStack_90._M_current = iStack_90._M_current + 1;
        }
        lVar12 = lVar12 + 1;
      } while (uVar13 + (uVar13 == 0) != lVar12);
    }
    uVar10 = (long)(to->pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(to->pred).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
    if (uVar13 < uVar10) {
      do {
        local_c8._8_8_ = local_c8._8_8_ & 0xffffffff00000000;
        local_c8._0_8_ =
             (to->pred).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar13];
        pBVar6 = SPIRVModule::get_builder(this->module);
        IVar5 = spv::Builder::makeBoolConstant(pBVar6,false,false);
        local_c8._8_4_ = IVar5;
        if (iStack_90._M_current == local_88) {
          std::
          vector<dxil_spv::IncomingValue,dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>>::
          _M_realloc_insert<dxil_spv::IncomingValue_const&>
                    ((vector<dxil_spv::IncomingValue,dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>>
                      *)&local_98,iStack_90,(IncomingValue *)local_c8);
        }
        else {
          (iStack_90._M_current)->block = (CFGNode *)local_c8._0_8_;
          *(undefined8 *)&(iStack_90._M_current)->id = local_c8._8_8_;
          iStack_90._M_current = iStack_90._M_current + 1;
        }
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
    }
    (to->ir).terminator.type = Condition;
    (to->ir).terminator.true_block = local_58;
    (to->ir).terminator.false_block = local_d0;
    (to->ir).terminator.direct_block = (CFGNode *)0x0;
    (to->ir).terminator.conditional_id = local_a8._M_allocated_capacity._0_4_;
    std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::
    emplace_back<dxil_spv::PHI>(&(to->ir).phi,(PHI *)&local_a8);
    CFGNode::add_branch(to,local_d0);
    recompute_cfg(this);
    if (local_98 != (void *)0x0) {
      free_in_thread(local_98);
    }
  }
  return pCVar2 != (CFGNode *)0x0;
}

Assistant:

bool CFGStructurizer::rewrite_invalid_loop_breaks()
{
	// Keep iterating here until we have validated a clean CFG w.r.t. block-like loops.
	// This should pass through first time without issue with extremely high probability,
	// so hitting the slow path isn't a real concern until proven otherwise.
	CFGNode *rewrite_header = nullptr;
	CFGNode *invalid_target = nullptr;

	// Process from inside out.
	for (auto *node : forward_post_visit_order)
	{
		// Structured loop constructs can end up with problematic merge scenarios where we missed
		// some cases where blocks branch outside our construct.
		// At some point, we were considered mere selection constructs and breaking out of it is fine,
		// but if the selection is promoted to a loop at some point after this analysis, we are a bit screwed.
		// This can happen in complex ladder resolve scenarios.
		// The fix-up means introducing multiple levels of ladder blocks.
		if (node->merge == MergeType::Loop && node->freeze_structured_analysis)
		{
			auto *merge = node->loop_merge_block;
			if (!merge || merge->post_dominates(node))
				continue;

			node->traverse_dominated_blocks([&](CFGNode *candidate) {
				if (candidate == merge || invalid_target)
					return false;

				// If the succ can reach outside the loop construct, we have an error condition.
				for (auto *succ : candidate->succ)
				{
					if (!query_reachability(*succ, *merge))
					{
						// Determine if we're an inner terminate/return, or a loop exit.
						// If the common post-dominator is EXIT node, this is a return-like relationship,
						// and we skip any fixup.
						auto *pdom = CFGNode::find_common_post_dominator(succ, merge);
						if (pdom != nullptr && !pdom->pred.empty())
							invalid_target = succ;
					}
				}
				return true;
			});

			if (invalid_target)
			{
				rewrite_header = node;
				break;
			}
		}
	}

	if (invalid_target)
	{
		auto *merge = rewrite_header->loop_merge_block;
		auto *dispatcher = create_helper_pred_block(merge);
		rewrite_header->loop_merge_block = dispatcher;

		size_t natural_preds = dispatcher->pred.size();
		traverse_dominated_blocks_and_rewrite_branch(rewrite_header, invalid_target, dispatcher);

		PHI phi;
		phi.id = module.allocate_id();
		phi.type_id = module.get_builder().makeBoolType();
		module.get_builder().addName(phi.id, (String("break_selector_") + merge->name).c_str());

		for (size_t i = 0; i < natural_preds; i++)
		{
			IncomingValue incoming = {};
			incoming.block = dispatcher->pred[i];
			incoming.id = module.get_builder().makeBoolConstant(true);
			phi.incoming.push_back(incoming);
		}

		for (size_t i = natural_preds, n = dispatcher->pred.size(); i < n; i++)
		{
			IncomingValue incoming = {};
			incoming.block = dispatcher->pred[i];
			incoming.id = module.get_builder().makeBoolConstant(false);
			phi.incoming.push_back(incoming);
		}

		dispatcher->ir.terminator.type = Terminator::Type::Condition;
		dispatcher->ir.terminator.true_block = merge;
		dispatcher->ir.terminator.false_block = invalid_target;
		dispatcher->ir.terminator.direct_block = nullptr;
		dispatcher->ir.terminator.conditional_id = phi.id;

		dispatcher->ir.phi.push_back(std::move(phi));
		dispatcher->add_branch(invalid_target);

		recompute_cfg();
		return true;
	}

	return false;
}